

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.cc
# Opt level: O0

EVP_PKEY * X509_PUBKEY_get0(X509_PUBKEY *key)

{
  X509_PUBKEY *key_local;
  
  if (key == (X509_PUBKEY *)0x0) {
    key_local = (X509_PUBKEY *)0x0;
  }
  else if (key->pkey == (EVP_PKEY *)0x0) {
    ERR_put_error(0xb,0,0x7d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_pubkey.cc"
                  ,0x7a);
    key_local = (X509_PUBKEY *)0x0;
  }
  else {
    key_local = (X509_PUBKEY *)key->pkey;
  }
  return (EVP_PKEY *)key_local;
}

Assistant:

EVP_PKEY *X509_PUBKEY_get0(const X509_PUBKEY *key) {
  if (key == NULL) {
    return NULL;
  }

  if (key->pkey == NULL) {
    OPENSSL_PUT_ERROR(X509, X509_R_PUBLIC_KEY_DECODE_ERROR);
    return NULL;
  }

  return key->pkey;
}